

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall ORPG::Characters::RaceSelector::RaceSelector(RaceSelector *this)

{
  initializer_list<ORPG::Characters::RaceSelector::race_node_*> __l;
  initializer_list<ORPG::Characters::RaceSelector::race_node_*> __l_00;
  initializer_list<ORPG::Characters::RaceSelector::race_node_*> __l_01;
  race_node *prVar1;
  race_node *local_90;
  race_node *local_88;
  race_node *local_80;
  iterator local_78;
  undefined8 local_70;
  race_node *local_68;
  iterator local_60;
  undefined8 local_58;
  race_node *local_50;
  iterator local_48;
  undefined8 local_40;
  race_node *local_38;
  race_node *highElf;
  race_node *elf;
  race_node *hillDwarf;
  race_node *dwarf;
  race_node *human;
  RaceSelector *this_local;
  
  human = (race_node *)this;
  prVar1 = allocate_node(this,0x1b800000,false,(race_node *)0x0);
  this->head = prVar1;
  dwarf = allocate_node(this,0x1b800001,true,this->head);
  hillDwarf = allocate_node(this,0x1b800010,true,this->head);
  elf = allocate_node(this,0x1b800011,true,hillDwarf);
  highElf = allocate_node(this,0x1b800020,true,this->head);
  local_38 = allocate_node(this,0x1b800021,true,highElf);
  local_50 = elf;
  local_48 = &local_50;
  local_40 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_48;
  std::
  vector<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
  ::operator=(&hillDwarf->children,__l_01);
  local_68 = local_38;
  local_60 = &local_68;
  local_58 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_60;
  std::
  vector<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
  ::operator=(&highElf->children,__l_00);
  local_90 = dwarf;
  local_88 = hillDwarf;
  local_80 = highElf;
  local_78 = &local_90;
  local_70 = 3;
  __l._M_len = 3;
  __l._M_array = local_78;
  std::
  vector<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
  ::operator=(&this->head->children,__l);
  this->current = this->head;
  return;
}

Assistant:

RaceSelector::RaceSelector() {
            head = allocate_node(Race::ID, false, NULL);

            auto human = allocate_node(Human::ID, true, head);

            auto dwarf = allocate_node(Dwarf::ID, true, head);
            auto hillDwarf = allocate_node(HillDwarf::ID, true, dwarf);

            auto elf = allocate_node(Elf::ID, true, head);
            auto highElf = allocate_node(HighElf::ID, true, elf);

            dwarf->children = {
                hillDwarf
            };

            elf->children = {
                highElf
            };

            head->children = {
                human,
                dwarf,
                elf
            };

            current = head;
        }